

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O3

endpoint_type * __thiscall
asio::
basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
::remote_endpoint(endpoint_type *__return_storage_ptr__,
                 basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *this)

{
  error_code __ec;
  error_code ec;
  error_code local_48;
  system_error local_38 [32];
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
            (__return_storage_ptr__,(this->impl_).service_,&(this->impl_).implementation_,&local_48)
  ;
  __ec._4_4_ = 0;
  __ec._M_value = local_48._M_value;
  if (local_48._M_value != 0) {
    __ec._M_cat = local_48._M_cat;
    std::system_error::system_error(local_38,__ec,"remote_endpoint");
    detail::throw_exception<std::system_error>(local_38);
    std::system_error::~system_error(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint() const
  {
    asio::error_code ec;
    endpoint_type ep = impl_.get_service().remote_endpoint(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "remote_endpoint");
    return ep;
  }